

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_unix.cpp
# Opt level: O0

void __thiscall TinyProcessLib::Process::close_fds(Process *this)

{
  bool bVar1;
  type piVar2;
  Process *this_local;
  
  bVar1 = std::thread::joinable(&this->stdout_stderr_thread);
  if (bVar1) {
    std::thread::join();
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->stdin_fd);
  if (bVar1) {
    close_stdin(this);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->stdout_fd);
  if (bVar1) {
    if (0 < (this->data).id) {
      piVar2 = std::unique_ptr<int,_std::default_delete<int>_>::operator*(&this->stdout_fd);
      close(*piVar2);
    }
    std::unique_ptr<int,_std::default_delete<int>_>::reset(&this->stdout_fd,(pointer)0x0);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->stderr_fd);
  if (bVar1) {
    if (0 < (this->data).id) {
      piVar2 = std::unique_ptr<int,_std::default_delete<int>_>::operator*(&this->stderr_fd);
      close(*piVar2);
    }
    std::unique_ptr<int,_std::default_delete<int>_>::reset(&this->stderr_fd,(pointer)0x0);
  }
  return;
}

Assistant:

void Process::close_fds() noexcept {
  if(stdout_stderr_thread.joinable())
    stdout_stderr_thread.join();

  if(stdin_fd)
    close_stdin();
  if(stdout_fd) {
    if(data.id > 0)
      close(*stdout_fd);
    stdout_fd.reset();
  }
  if(stderr_fd) {
    if(data.id > 0)
      close(*stderr_fd);
    stderr_fd.reset();
  }
}